

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  ImGuiColumns *columns;
  ImGuiColumnData *pIVar6;
  ImGuiStoragePair *pIVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar9;
  int n;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  ImVector<ImGuiColumnData> *this;
  char *pcVar17;
  int column_n;
  uint uVar18;
  char *pcVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  if (window->Active == false) {
    uVar11 = (ulong)window->WasActive;
  }
  else {
    uVar11 = 1;
  }
  bVar4 = TreeNode(label,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar11,window);
  bVar5 = IsItemHovered(0);
  pcVar9 = extraout_RDX;
  if ((bVar5) && (window->WasActive == true)) {
    local_38.x = (window->Size).x + (window->Pos).x;
    local_38.y = (window->Size).y + (window->Pos).y;
    ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0);
    pcVar9 = extraout_RDX_00;
  }
  if (!bVar4) {
    return;
  }
  if (window->WasActive == false) {
    TextDisabled("Note: window is not currently visible.");
    pcVar9 = extraout_RDX_01;
  }
  if (window->MemoryCompacted == true) {
    TextDisabled("Note: some memory buffers have been compacted/freed.");
    pcVar9 = extraout_RDX_02;
  }
  uVar18 = window->Flags;
  NodeDrawList(window,window->DrawList,pcVar9);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",(double)(window->Pos).x,
             (double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->ContentSize).x,(double)(window->ContentSize).y);
  pcVar9 = "Child ";
  if ((uVar18 >> 0x18 & 1) == 0) {
    pcVar9 = "";
  }
  auVar22._0_4_ = -(uint)((uVar18 & 0x10000000) == 0);
  auVar22._4_4_ = -(uint)((uVar18 & 0x8000000) == 0);
  auVar22._8_4_ = -(uint)((uVar18 & 0x4000000) == 0);
  auVar22._12_4_ = -(uint)((uVar18 & 0x2000000) == 0);
  auVar21._0_4_ = -(uint)((uVar18 & 0x40) == 0);
  auVar21._4_4_ = -(uint)((uVar18 & 0x40000) == 0);
  auVar21._8_4_ = -(uint)((uVar18 & 0x200) == 0);
  auVar21._12_4_ = -(uint)((uVar18 & 0x100) == 0);
  auVar22 = packssdw(auVar21,auVar22);
  auVar22 = packsswb(auVar22,auVar22);
  pcVar8 = "Tooltip ";
  if ((auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar8 = "";
  }
  pcVar12 = "Popup ";
  if ((auVar22 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar12 = "";
  }
  pcVar13 = "Modal ";
  if ((auVar22 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((auVar22 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar19 = "NoMouseInputs";
  if ((auVar22 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar19 = "";
  }
  pcVar16 = "NoNavInputs";
  if ((auVar22 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  pcVar17 = "AlwaysAutoResize";
  if ((auVar22 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar18,pcVar9,pcVar8,pcVar12,pcVar13,
             pcVar14,pcVar15,pcVar19,pcVar16,pcVar17);
  pcVar9 = "##X";
  if (window->ScrollbarX == false) {
    pcVar9 = "\n\n";
  }
  pcVar8 = "##Y";
  if (window->ScrollbarY == false) {
    pcVar8 = "\n\n";
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y,
             pcVar9 + 2,pcVar8 + 2);
  if ((window->Active == false) && (window->WasActive == false)) {
    uVar11 = 0xffffffffffffffff;
  }
  else {
    uVar11 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar11);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)window->HiddenFramesCanSkipItems,
             (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar9 = "NULL";
  }
  else {
    pcVar9 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar9);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar20 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar20) {
    fVar2 = window->NavRectRel[0].Min.y;
    fVar3 = window->NavRectRel[0].Max.y;
    if (fVar2 <= fVar3) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2,(double)fVar20,
                 (double)fVar3);
      goto LAB_001591f5;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_001591f5:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar4 = TreeNode("Columns","Columns sets (%d)"), bVar4)) {
    for (iVar10 = 0; iVar10 < (window->ColumnsStorage).Size; iVar10 = iVar10 + 1) {
      columns = ImVector<ImGuiColumns>::operator[](&window->ColumnsStorage,iVar10);
      bVar4 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                       (void *)(ulong)columns->ID,(ulong)(uint)columns->Count,
                       (ulong)(uint)columns->Flags);
      if (bVar4) {
        BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                   (double)(columns->OffMaxX - columns->OffMinX),(double)columns->OffMinX,
                   (double)columns->OffMaxX);
        this = &columns->Columns;
        for (uVar18 = 0; (int)uVar18 < this->Size; uVar18 = uVar18 + 1) {
          pIVar6 = ImVector<ImGuiColumnData>::operator[](this,uVar18);
          fVar1 = pIVar6->OffsetNorm;
          pIVar6 = ImVector<ImGuiColumnData>::operator[](this,uVar18);
          fVar20 = GetColumnOffsetFromNorm(columns,pIVar6->OffsetNorm);
          BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,(double)fVar20,
                     (ulong)uVar18);
        }
        TreePop();
      }
    }
    TreePop();
  }
  uVar18 = (window->StateStorage).Data.Size;
  bVar4 = TreeNode("Storage","%s: %d entries, %d bytes","Storage",(ulong)uVar18,(ulong)(uVar18 << 4)
                  );
  if (bVar4) {
    for (iVar10 = 0; iVar10 < (window->StateStorage).Data.Size; iVar10 = iVar10 + 1) {
      pIVar7 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                         (&(window->StateStorage).Data,iVar10);
      BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar7->key,
                 (ulong)(uint)(pIVar7->field_1).val_i);
    }
    TreePop();
  }
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (!window->WasActive)
                ImGui::TextDisabled("Note: window is not currently visible.");
            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }